

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Snapshot * __thiscall leveldb::DBImpl::GetSnapshot(DBImpl *this)

{
  SnapshotImpl *pSVar1;
  
  std::mutex::lock(&(this->mutex_).mu_);
  pSVar1 = SnapshotList::New(&this->snapshots_,this->versions_->last_sequence_);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return &pSVar1->super_Snapshot;
}

Assistant:

const Snapshot* DBImpl::GetSnapshot() {
  MutexLock l(&mutex_);
  return snapshots_.New(versions_->LastSequence());
}